

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_read_value(t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  bool bVar1;
  ostream *poVar2;
  reference pptVar3;
  string *psVar4;
  t_type *ttype;
  allocator local_119;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_88;
  string local_68;
  t_field *local_48;
  t_field *field;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  t_struct *tstruct_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,
                           "protected Object readValue(TProtocol iprot, TField field) throws TException {"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"_Fields setField = _Fields.findByThriftId(field.id);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"if (setField != null) {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"switch (setField) {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    local_48 = *pptVar3;
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"case ");
    psVar4 = t_field::get_name_abi_cxx11_(local_48);
    std::__cxx11::string::string((string *)&local_88,(string *)psVar4);
    constant_name(&local_68,this,&local_88);
    poVar2 = std::operator<<(poVar2,(string *)&local_68);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    t_generator::indent_up((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"if (field.type == ");
    psVar4 = t_field::get_name_abi_cxx11_(local_48);
    std::__cxx11::string::string((string *)&local_d8,(string *)psVar4);
    constant_name(&local_b8,this,&local_d8);
    poVar2 = std::operator<<(poVar2,(string *)&local_b8);
    poVar2 = std::operator<<(poVar2,"_FIELD_DESC.type) {");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    t_generator::indent_up((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,out);
    ttype = t_field::get_type(local_48);
    type_name_abi_cxx11_(&local_f8,this,ttype,true,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_f8);
    poVar2 = std::operator<<(poVar2," ");
    psVar4 = t_field::get_name_abi_cxx11_(local_48);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f8);
    tfield = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"",&local_119);
    generate_deserialize_field(this,out,tfield,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"return ");
    psVar4 = t_field::get_name_abi_cxx11_(local_48);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"} else {");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"  TProtocolUtil.skip(iprot, field.type);");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"  return null;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"default:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,
                           "  throw new IllegalStateException(\"setField wasn\'t null, but didn\'t match any of the case statements!\");"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"} else {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"TProtocolUtil.skip(iprot, field.type);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"return null;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_javame_generator::generate_read_value(ostream& out, t_struct* tstruct) {
  indent(out) << "protected Object readValue(TProtocol iprot, TField field) throws TException {"
              << endl;

  indent_up();

  indent(out) << "_Fields setField = _Fields.findByThriftId(field.id);" << endl;
  indent(out) << "if (setField != null) {" << endl;
  indent_up();
  indent(out) << "switch (setField) {" << endl;
  indent_up();

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_field* field = (*m_iter);

    indent(out) << "case " << constant_name(field->get_name()) << ":" << endl;
    indent_up();
    indent(out) << "if (field.type == " << constant_name(field->get_name()) << "_FIELD_DESC.type) {"
                << endl;
    indent_up();
    indent(out) << type_name(field->get_type(), true, false) << " " << field->get_name() << ";"
                << endl;
    generate_deserialize_field(out, field, "");
    indent(out) << "return " << field->get_name() << ";" << endl;
    indent_down();
    indent(out) << "} else {" << endl;
    indent(out) << "  TProtocolUtil.skip(iprot, field.type);" << endl;
    indent(out) << "  return null;" << endl;
    indent(out) << "}" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent(out) << "  throw new IllegalStateException(\"setField wasn't null, but didn't match any "
                 "of the case statements!\");" << endl;

  indent_down();
  indent(out) << "}" << endl;

  indent_down();
  indent(out) << "} else {" << endl;
  indent_up();
  indent(out) << "TProtocolUtil.skip(iprot, field.type);" << endl;
  indent(out) << "return null;" << endl;
  indent_down();
  indent(out) << "}" << endl;

  indent_down();
  indent(out) << "}" << endl;
}